

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O1

UInt32 crnlib::Bt4_MatchFinder_GetMatches(CMatchFinder *p,UInt32 *distances)

{
  uint lenLimit;
  CLzRef CVar1;
  CLzRef CVar2;
  byte *cur;
  CLzRef *pCVar3;
  uint uVar4;
  UInt32 UVar5;
  UInt32 *pUVar6;
  uint uVar7;
  uint uVar8;
  UInt32 UVar9;
  ulong uVar10;
  bool bVar11;
  
  lenLimit = p->lenLimit;
  if (lenLimit < 4) {
    MatchFinder_MovePos(p);
    return 0;
  }
  cur = p->buffer;
  uVar4 = (uint)cur[1] ^ p->crc[*cur];
  uVar7 = (uint)cur[2] << 8 ^ uVar4;
  uVar4 = uVar4 & 0x3ff;
  uVar10 = (ulong)(uVar7 & 0xffff);
  UVar9 = p->pos;
  pCVar3 = p->hash;
  CVar1 = pCVar3[uVar4];
  uVar8 = UVar9 - CVar1;
  CVar2 = pCVar3[uVar10 + 0x400];
  uVar7 = ((p->crc[cur[3]] << 5 ^ uVar7) & p->hashMask) + 0x10400;
  UVar5 = pCVar3[uVar7];
  pCVar3[uVar7] = UVar9;
  pCVar3[uVar10 + 0x400] = UVar9;
  pCVar3[uVar4] = UVar9;
  uVar4 = 1;
  uVar10 = 0;
  if ((uVar8 < p->cyclicBufferSize) && (cur[-(ulong)uVar8] == *cur)) {
    *distances = 2;
    distances[1] = uVar8 - 1;
    uVar10 = 2;
    uVar4 = 2;
  }
  if (((CVar2 != CVar1) && (uVar7 = UVar9 - CVar2, uVar7 < p->cyclicBufferSize)) &&
     (cur[-(ulong)uVar7] == *cur)) {
    distances[uVar10 + 1] = uVar7 - 1;
    uVar10 = (ulong)((int)uVar10 + 2);
    uVar4 = 3;
    uVar8 = uVar7;
  }
  UVar9 = (UInt32)uVar10;
  if (UVar9 == 0) {
LAB_001a2bd0:
    UVar9 = 3;
    if (3 < uVar4) {
      UVar9 = uVar4;
    }
    pUVar6 = GetMatchesSpec1(lenLimit,UVar5,p->pos,cur,p->son,p->cyclicBufferPos,p->cyclicBufferSize
                             ,p->cutValue,distances + uVar10,UVar9);
    UVar9 = (UInt32)((ulong)((long)pUVar6 - (long)distances) >> 2);
  }
  else {
    bVar11 = uVar4 == lenLimit;
    uVar7 = uVar4;
    if (bVar11) {
LAB_001a2c14:
      distances[UVar9 - 2] = uVar7;
    }
    else {
      if (cur[(ulong)uVar4 - (ulong)uVar8] == cur[uVar4]) {
        do {
          uVar4 = uVar4 + 1;
          bVar11 = lenLimit == uVar4;
          uVar7 = lenLimit;
          if (bVar11) goto LAB_001a2c14;
        } while (cur[(ulong)uVar4 - (ulong)uVar8] == cur[uVar4]);
      }
      distances[UVar9 - 2] = uVar4;
      if (!bVar11) goto LAB_001a2bd0;
    }
    SkipMatchesSpec(lenLimit,UVar5,p->pos,cur,p->son,p->cyclicBufferPos,p->cyclicBufferSize,
                    p->cutValue);
  }
  p->cyclicBufferPos = p->cyclicBufferPos + 1;
  p->buffer = p->buffer + 1;
  UVar5 = p->pos + 1;
  p->pos = UVar5;
  if (UVar5 == p->posLimit) {
    MatchFinder_CheckLimits(p);
  }
  return UVar9;
}

Assistant:

static UInt32 Bt4_MatchFinder_GetMatches(CMatchFinder* p, UInt32* distances) {
  UInt32 hash2Value, hash3Value, delta2, delta3, maxLen, offset;
  GET_MATCHES_HEADER(4)

  HASH4_CALC;

  delta2 = p->pos - p->hash[hash2Value];
  delta3 = p->pos - p->hash[kFix3HashSize + hash3Value];
  curMatch = p->hash[kFix4HashSize + hashValue];

  p->hash[hash2Value] =
      p->hash[kFix3HashSize + hash3Value] =
          p->hash[kFix4HashSize + hashValue] = p->pos;

  maxLen = 1;
  offset = 0;
  if (delta2 < p->cyclicBufferSize && *(cur - delta2) == *cur) {
    distances[0] = maxLen = 2;
    distances[1] = delta2 - 1;
    offset = 2;
  }
  if (delta2 != delta3 && delta3 < p->cyclicBufferSize && *(cur - delta3) == *cur) {
    maxLen = 3;
    distances[offset + 1] = delta3 - 1;
    offset += 2;
    delta2 = delta3;
  }
  if (offset != 0) {
    for (; maxLen != lenLimit; maxLen++)
      if (cur[(ptrdiff_t)maxLen - delta2] != cur[maxLen])
        break;
    distances[offset - 2] = maxLen;
    if (maxLen == lenLimit) {
      SkipMatchesSpec(lenLimit, curMatch, MF_PARAMS(p));
      MOVE_POS_RET;
    }
  }
  if (maxLen < 3)
    maxLen = 3;
  GET_MATCHES_FOOTER(offset, maxLen)
}